

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_posix.cpp
# Opt level: O0

void anon_unknown.dwarf_fd7da::raise_cannot_create_fifo(czstring path,int errcode)

{
  ostream *__os;
  _Quoted_string<const_char_*,_char> _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [36];
  errno_erc local_1c4;
  _Quoted_string<const_char_*,_char> local_1c0;
  _Quoted_string<const_char_*,_char> local_1b0 [2];
  ostringstream local_190 [8];
  ostringstream str;
  int errcode_local;
  czstring path_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  __os = std::operator<<((ostream *)local_190,"Could not create FIFO at ");
  _Var1 = pstore::quoted(path);
  local_1b0[0]._M_string = _Var1._M_string;
  local_1c0._8_2_ = _Var1._8_2_;
  local_1b0[0]._M_delim = local_1c0._M_delim;
  local_1b0[0]._M_escape = local_1c0._M_escape;
  local_1c0 = _Var1;
  std::__detail::operator<<(__os,local_1b0);
  pstore::errno_erc::errno_erc(&local_1c4,errcode);
  std::__cxx11::ostringstream::str();
  pstore::raise<pstore::errno_erc,std::__cxx11::string>(local_1c4,local_1e8);
}

Assistant:

PSTORE_NO_RETURN void raise_cannot_create_fifo (pstore::gsl::czstring const path,
                                                    int const errcode) {
        std::ostringstream str;
        str << "Could not create FIFO at " << pstore::quoted (path);
        raise (pstore::errno_erc{errcode}, str.str ());
    }